

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

bool (anonymous_namespace)::
     TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&,(anonymous_namespace)::cmProjectDirectoryListGenerator&>
               (anon_class_8_1_8991fb9c *filesCollector,string *startPath,
               cmProjectDirectoryListGenerator *gen)

{
  size_type sVar1;
  bool bVar2;
  string path;
  string local_70;
  string local_50;
  
  anon_unknown.dwarf_485276::cmDirectoryListGenerator::Reset(&gen->super_cmDirectoryListGenerator);
  anon_unknown.dwarf_485276::cmDirectoryListGenerator::GetNextCandidate
            (&local_70,&gen->super_cmDirectoryListGenerator,startPath);
  while (sVar1 = local_70._M_string_length, local_70._M_string_length != 0) {
    bVar2 = TryGeneratedPaths<cmFindPackageCommand::SearchPrefix(std::__cxx11::string_const&)::__0&>
                      (filesCollector,&local_70);
    if (bVar2) break;
    anon_unknown.dwarf_485276::cmDirectoryListGenerator::GetNextCandidate
              (&local_50,&gen->super_cmDirectoryListGenerator,startPath);
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&local_70);
  return sVar1 != 0;
}

Assistant:

bool TryGeneratedPaths(CallbackFn&& filesCollector,
                       const std::string& startPath, Generator&& gen,
                       Rest&&... tail)
{
  ResetGenerator(std::forward<Generator&&>(gen));
  for (auto path = gen.GetNextCandidate(startPath); !path.empty();
       path = gen.GetNextCandidate(startPath)) {
    ResetGenerator(std::forward<Rest&&>(tail)...);
    if (TryGeneratedPaths(std::forward<CallbackFn&&>(filesCollector), path,
                          std::forward<Rest&&>(tail)...)) {
      return true;
    }
  }
  return false;
}